

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

size_t __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  bool bVar1;
  int iVar2;
  void **ppvVar3;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value;
  size_t sVar4;
  size_t local_40;
  int local_2c;
  int i;
  void **elems;
  size_t sStack_18;
  int n;
  size_t allocated_bytes;
  RepeatedPtrFieldBase *this_local;
  
  bVar1 = using_sso(this);
  if (bVar1) {
    local_40 = 0;
  }
  else {
    iVar2 = Capacity(this);
    local_40 = (long)iVar2 * 8 + 8;
  }
  sStack_18 = local_40;
  iVar2 = allocated_size(this);
  ppvVar3 = elements(this);
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    value = cast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                      (ppvVar3[local_2c]);
    sVar4 = GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::SpaceUsedLong(value);
    sStack_18 = sVar4 + sStack_18;
  }
  return sStack_18;
}

Assistant:

PROTOBUF_NOINLINE size_t SpaceUsedExcludingSelfLong() const {
    size_t allocated_bytes =
        using_sso()
            ? 0
            : static_cast<size_t>(Capacity()) * sizeof(void*) + kRepHeaderSize;
    const int n = allocated_size();
    void* const* elems = elements();
    for (int i = 0; i < n; ++i) {
      allocated_bytes +=
          TypeHandler::SpaceUsedLong(*cast<TypeHandler>(elems[i]));
    }
    return allocated_bytes;
  }